

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::subIf(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  RefToken *t;
  ASTArray *nodes;
  ASTArray *this_00;
  AST *this_01;
  AST *other;
  AST *this_02;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp181_AST;
  RefAST tmp180_AST;
  RefAST tmp179_AST;
  RefAST tmp178_AST;
  RefAST C3x_AST;
  RefAST C3k_AST;
  RefToken C3k;
  RefAST C3_AST;
  RefAST C2x_AST;
  RefAST C2_AST;
  RefAST C1x_AST;
  RefAST C1_AST;
  RefAST E_AST;
  RefAST C1k_AST;
  RefToken C1k;
  RefAST subIf_AST;
  ASTPair currentAST;
  AST *in_stack_fffffffffffffcf8;
  AST *in_stack_fffffffffffffd00;
  AST *in_stack_fffffffffffffd08;
  AST *in_stack_fffffffffffffd10;
  RefCount<AST> *in_stack_fffffffffffffd18;
  ASTArray *in_stack_fffffffffffffd20;
  RefToken *in_stack_fffffffffffffd30;
  ASTFactory *in_stack_fffffffffffffd38;
  GrpParser *in_stack_fffffffffffffd40;
  GrpParser *in_stack_fffffffffffffd50;
  ASTFactory *in_stack_fffffffffffffd58;
  RefToken *in_stack_fffffffffffffd78;
  NoViableAltException *in_stack_fffffffffffffd80;
  RefCount local_1b8 [63];
  undefined1 local_179;
  undefined1 local_178 [8];
  undefined1 local_170 [24];
  undefined1 local_158 [31];
  undefined1 local_139;
  undefined1 local_138 [48];
  undefined1 local_108 [15];
  undefined1 local_f9;
  undefined1 local_f8 [40];
  undefined1 local_d0 [24];
  undefined1 local_b8 [40];
  undefined1 local_90 [112];
  RefCount<AST> local_20 [4];
  
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  ASTPair::ASTPair((ASTPair *)in_stack_fffffffffffffd10);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffd10,
             (RefCount<Token> *)in_stack_fffffffffffffd08);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffd10,
             (RefCount<Token> *)in_stack_fffffffffffffd08);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  (**(code **)(*in_RDI + 0x28))(local_90,in_RDI,1);
  RefCount<Token>::operator=
            ((RefCount<Token> *)in_stack_fffffffffffffd20,
             (RefCount<Token> *)in_stack_fffffffffffffd18);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffd10,
             (RefCount<Token> *)in_stack_fffffffffffffd08);
  ASTFactory::create(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
  Parser::match((Parser *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20))
  ;
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
  Parser::match((Parser *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20))
  ;
  expr(in_stack_fffffffffffffd40);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  (**(code **)(*in_RDI + 0x28))(local_d0,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
  Parser::match((Parser *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20))
  ;
  subEntryList(in_stack_fffffffffffffd50);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  operator_new(0x20);
  ASTArray::ASTArray(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
  ASTFactory::make(in_stack_fffffffffffffd58,(ASTArray *)in_stack_fffffffffffffd50);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((iVar2 < 0x29) || (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), 0x2c < iVar2)) {
LAB_0022075a:
    iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if ((iVar2 != 0x29) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar2 != 0x2a)) {
LAB_00220849:
      local_f9 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_f8,in_RDI,1);
      NoViableAltException::NoViableAltException
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_f9 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffd08,
                           (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    if (!bVar1) goto LAB_00220849;
    (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffd08,
                           (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    if (!bVar1) goto LAB_00220849;
  }
  else {
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffd08,
                           (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    if (!bVar1) goto LAB_0022075a;
    (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffd08,
                           (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    if (!bVar1) goto LAB_0022075a;
    subElseIfList(in_stack_fffffffffffffd50);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 0x29) {
    (**(code **)(*in_RDI + 0x28))(local_108,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffd20,
               (RefCount<Token> *)in_stack_fffffffffffffd18);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
    RefCount<Token>::RefCount
              ((RefCount<Token> *)in_stack_fffffffffffffd10,
               (RefCount<Token> *)in_stack_fffffffffffffd08);
    ASTFactory::create(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
    Parser::match((Parser *)in_stack_fffffffffffffd40,
                  (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    subEntryList(in_stack_fffffffffffffd50);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    operator_new(0x20);
    ASTArray::ASTArray(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
    ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
    in_stack_fffffffffffffd80 =
         (NoViableAltException *)
         ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
    ASTFactory::make(in_stack_fffffffffffffd58,(ASTArray *)in_stack_fffffffffffffd50);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  }
  else if (iVar2 != 0x2a) {
    local_139 = 1;
    t = (RefToken *)__cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_138,in_RDI,1);
    NoViableAltException::NoViableAltException(in_stack_fffffffffffffd80,t);
    local_139 = 0;
    __cxa_throw(t,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  (**(code **)(*in_RDI + 0x28))(local_158,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
  Parser::match((Parser *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20))
  ;
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 != 6) {
    if (iVar2 == 8) {
      RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
      (**(code **)(*in_RDI + 0x28))(local_170,in_RDI,1);
      ASTFactory::create(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      iVar2 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
      RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18)
      ;
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
      Parser::match((Parser *)in_stack_fffffffffffffd40,iVar2);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
    }
    else if ((((1 < iVar2 - 9U) && (2 < iVar2 - 0xdU)) && (5 < iVar2 - 0x1aU)) &&
            (((6 < iVar2 - 0x26U && (iVar2 != 0x30)) && ((1 < iVar2 - 0x32U && (iVar2 != 0x35))))))
    {
      local_179 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_178,in_RDI,1);
      NoViableAltException::NoViableAltException
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_179 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
  }
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  nodes = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
  ASTFactory::create(in_stack_fffffffffffffd58,(int)((ulong)nodes >> 0x20));
  this_00 = ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->down);
  ASTFactory::make(in_stack_fffffffffffffd58,nodes);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  bVar1 = false;
  this_01 = RefCount::operator_cast_to_AST_((RefCount *)local_20);
  other = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
  if (this_01 != other) {
    in_stack_fffffffffffffd10 = RefCount<AST>::operator->(local_20);
    AST::getFirstChild(in_stack_fffffffffffffcf8);
    bVar1 = true;
    in_stack_fffffffffffffd08 = RefCount::operator_cast_to_AST_(local_1b8);
    in_stack_fffffffffffffd00 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
    if (in_stack_fffffffffffffd08 != in_stack_fffffffffffffd00) {
      this_02 = RefCount<AST>::operator->(local_20);
      AST::getFirstChild(this_02);
      goto LAB_00221361;
    }
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd10->down,&in_stack_fffffffffffffd08->down);
LAB_00221361:
  RefCount<AST>::operator=(&this_01->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  if (bVar1) {
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  }
  ASTPair::advanceChildToEnd((ASTPair *)this_00);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::operator=(&this_01->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd10);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd00->down);
  ASTPair::~ASTPair((ASTPair *)in_stack_fffffffffffffd00);
  return;
}

Assistant:

void GrpParser::subIf() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST subIf_AST = nullAST;
	RefToken  C1k = nullToken;
	RefAST C1k_AST = nullAST;
	RefAST E_AST = nullAST;
	RefAST C1_AST = nullAST;
	RefAST C1x_AST = nullAST;
	RefAST C2_AST = nullAST;
	RefAST C2x_AST = nullAST;
	RefAST C3_AST = nullAST;
	RefToken  C3k = nullToken;
	RefAST C3k_AST = nullAST;
	RefAST C3x_AST = nullAST;
	
	try {      // for error handling
		C1k = LT(1);
		C1k_AST = astFactory.create(C1k);
		match(LITERAL_if);
		RefAST tmp178_AST = nullAST;
		tmp178_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		expr();
		E_AST = returnAST;
		RefAST tmp179_AST = nullAST;
		tmp179_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		subEntryList();
		C1x_AST = returnAST;
		C1_AST = astFactory.make( (new ASTArray(3))->add(C1k_AST)->add(E_AST)->add(C1x_AST));
		}
		{
		if (((LA(1) >= LITERAL_else && LA(1) <= LITERAL_elseif)) && (_tokenSet_48.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			subElseIfList();
			C2x_AST = returnAST;
			C2_AST = C2x_AST;
		}
		else if ((LA(1)==LITERAL_else||LA(1)==LITERAL_endif) && (_tokenSet_48.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		switch ( LA(1)) {
		case LITERAL_else:
		{
			C3k = LT(1);
			C3k_AST = astFactory.create(C3k);
			match(LITERAL_else);
			subEntryList();
			C3x_AST = returnAST;
			C3_AST = astFactory.make( (new ASTArray(2))->add(C3k_AST)->add(C3x_AST));
			break;
		}
		case LITERAL_endif:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp180_AST = nullAST;
		tmp180_AST = astFactory.create(LT(1));
		match(LITERAL_endif);
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp181_AST = nullAST;
			tmp181_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_LPAREN:
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_endpass:
		case LITERAL_if:
		case LITERAL_else:
		case LITERAL_endif:
		case Zelseif:
		case LITERAL_elseif:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		subIf_AST = currentAST.root;
		subIf_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZifStruct))->add(C1_AST)->add(C2_AST)->add(C3_AST));
		currentAST.root = subIf_AST;
		currentAST.child = subIf_AST!=nullAST &&subIf_AST->getFirstChild()!=nullAST ?
			subIf_AST->getFirstChild() : subIf_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_47);
	}
	returnAST = subIf_AST;
}